

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  uint uVar1;
  ZSTD_longOffset_e isLongOffset_00;
  size_t sVar2;
  sbyte sVar3;
  int in_ECX;
  size_t in_RDX;
  void *in_RSI;
  int *in_RDI;
  ulong in_R8;
  int in_R9D;
  size_t in_stack_00000018;
  U32 minShare;
  U32 shareLongOffsets;
  size_t seqHSize;
  int nbSeq;
  size_t litCSize;
  ZSTD_longOffset_e isLongOffset;
  BYTE *ip;
  int in_stack_ffffffffffffff84;
  ulong in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 uVar4;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  ZSTD_DCtx *in_stack_fffffffffffffff8;
  void *dst_00;
  
  uVar1 = MEM_32bits();
  uVar4 = false;
  if ((uVar1 != 0) &&
     (in_stack_ffffffffffffff96 = true, uVar4 = in_stack_ffffffffffffff96, in_R9D != 0)) {
    in_stack_ffffffffffffff88 = *(ulong *)(in_RDI + 0x1c1e);
    uVar1 = MEM_32bits();
    sVar3 = 0x39;
    if (uVar1 != 0) {
      sVar3 = 0x19;
    }
    in_stack_ffffffffffffff96 = (ulong)(1L << sVar3) < in_stack_ffffffffffffff88;
    uVar4 = in_stack_ffffffffffffff96;
  }
  if (in_R8 < 0x20000) {
    dst_00 = (void *)ZSTD_decodeLiteralsBlock((ZSTD_DCtx *)seqHSize,_minShare,in_stack_00000018);
    uVar1 = ERR_isError((size_t)dst_00);
    if (uVar1 == 0) {
      in_ECX = (int)dst_00 + in_ECX;
      dst_00 = (void *)ZSTD_decodeSeqHeaders(in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX);
      uVar1 = ERR_isError((size_t)dst_00);
      if (uVar1 == 0) {
        isLongOffset_00 = (int)dst_00 + in_ECX;
        if (((in_R9D == 0) || (0x1000000 < *(ulong *)(in_RDI + 0x1c1e))) &&
           (0 < in_stack_ffffffffffffffac)) {
          in_stack_ffffffffffffff9c = ZSTD_getLongOffsetsShare(*(ZSTD_seqSymbol **)(in_RDI + 4));
          uVar1 = MEM_64bits();
          in_stack_ffffffffffffff98 = 0x14;
          if (uVar1 != 0) {
            in_stack_ffffffffffffff98 = 7;
          }
          if (in_stack_ffffffffffffff98 <= in_stack_ffffffffffffff9c) {
            sVar2 = ZSTD_decompressSequencesLong
                              ((ZSTD_DCtx *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),dst_00,
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                               (void *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff96,
                                                               in_stack_ffffffffffffff90)),
                               in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,isLongOffset_00);
            return sVar2;
          }
        }
        dst_00 = (void *)ZSTD_decompressSequences
                                   ((ZSTD_DCtx *)
                                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                    dst_00,CONCAT44(in_stack_ffffffffffffff9c,
                                                    in_stack_ffffffffffffff98),
                                    (void *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff96,
                                                                    in_stack_ffffffffffffff90)),
                                    in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                                    isLongOffset_00);
      }
    }
  }
  else {
    dst_00 = (void *)0xffffffffffffffb8;
  }
  return (size_t)dst_00;
}

Assistant:

static size_t ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                            void* dst, size_t dstCapacity,
                      const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative. (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN)));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    if (srcSize >= ZSTD_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {   int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

        if ( (!frame || dctx->fParams.windowSize > (1<<24))
          && (nbSeq>0) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            if (shareLongOffsets >= minShare)
                return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
        }

        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
    }
}